

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O1

void __thiscall pstore::storage::update_master_pointers(storage *this,size_t old_length)

{
  sat_iterator segment_end;
  pointer psVar1;
  element_type *peVar2;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  sat_iterator pvVar6;
  sat_iterator pvVar7;
  long *plVar8;
  reference ptVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  shared_ptr<pstore::memory_mapper_base> *region;
  span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> sStack_80;
  span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> sStack_70;
  span<pstore::sat_entry,_65536L> sStack_60;
  storage_type<pstore::gsl::details::extent_type<_1L>_> sStack_58;
  
  if (old_length == 0) {
    uVar5 = 0;
  }
  else {
    psVar1 = (this->regions_).
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->regions_).
                      super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= old_length)
    {
      assert_failed("old_length < regions_.size ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x80);
    }
    peVar2 = psVar1[old_length - 1].
             super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = peVar2->size_ + peVar2->offset_ >> 0x16;
    uVar16 = uVar5 - 1;
    if (0xffff < uVar16) {
      pcVar18 = "array::at: __n (which is %zu) >= _Nm (which is %zu)";
      std::__throw_out_of_range_fmt
                ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar16,0x10000);
      while (lVar15 = *(long *)((long)pcVar18 + 0x30), *(long *)((long)pcVar18 + 0x28) != lVar15) {
        uVar5 = *(ulong *)(*(long *)(lVar15 + -0x10) + 0x20);
        if (((uVar5 & 0x3fffff) != 0) ||
           (uVar13 = *(ulong *)(*(long *)(lVar15 + -0x10) + 0x28), (uVar13 & 0x3fffff) != 0)) {
          assert_failed("region->offset () % address::segment_size == 0 && region->size () % address::segment_size == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                        ,0x58);
        }
        if (uVar5 < uVar16) {
          lVar15 = *(long *)pcVar18;
          uVar13 = uVar13 + uVar5 >> 0x11;
          plVar10 = (long *)(lVar15 + uVar13);
          plVar8 = (long *)(lVar15 + 0x200000);
          lVar17 = (long)(0x200000 - uVar13) >> 7;
          if (0 < lVar17) {
            plVar10 = (long *)((long)plVar10 + (0x200000 - uVar13 & 0xffffffffffffff80));
            lVar17 = lVar17 + 1;
            plVar14 = (long *)(uVar13 + lVar15 + 0x40);
            do {
              if (plVar14[-6] != 0 || plVar14[-8] != 0) {
                plVar14 = plVar14 + -8;
                goto LAB_001313a5;
              }
              if (plVar14[-2] != 0 || plVar14[-4] != 0) {
                plVar14 = plVar14 + -4;
                goto LAB_001313a5;
              }
              if (plVar14[2] != 0 || *plVar14 != 0) goto LAB_001313a5;
              if (plVar14[6] != 0 || plVar14[4] != 0) {
                plVar14 = plVar14 + 4;
                goto LAB_001313a5;
              }
              lVar17 = lVar17 + -1;
              plVar14 = plVar14 + 0x10;
            } while (1 < lVar17);
          }
          lVar15 = (long)plVar8 - (long)plVar10 >> 5;
          if (lVar15 == 1) {
LAB_00131396:
            plVar14 = plVar10;
            if (plVar10[2] == 0 && *plVar10 == 0) {
              plVar14 = plVar8;
            }
          }
          else if (lVar15 == 2) {
LAB_0013123e:
            plVar14 = plVar10;
            if (plVar10[2] == 0 && *plVar10 == 0) {
              plVar10 = plVar10 + 4;
              goto LAB_00131396;
            }
          }
          else {
            plVar14 = plVar8;
            if ((lVar15 == 3) && (plVar14 = plVar10, plVar10[2] == 0 && *plVar10 == 0)) {
              plVar10 = plVar10 + 4;
              goto LAB_0013123e;
            }
          }
LAB_001313a5:
          if (plVar14 != plVar8) {
            assert_failed("std::all_of (std::begin (*sat_) + region->end () / address::segment_size, std::end (*sat_), [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                          ,0x5f);
          }
        }
        else {
          sStack_60.storage_.data_ =
               *(storage_type<pstore::gsl::details::extent_type<65536L>_> *)pcVar18;
          sStack_58 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                      gsl::span<pstore::sat_entry,_65536L>::subspan
                                (&sStack_60,*(ulong *)(*(long *)(lVar15 + -0x10) + 0x20) >> 0x16,
                                 *(ulong *)(*(long *)(lVar15 + -0x10) + 0x28) >> 0x16);
          gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::
          span_iterator(&sStack_70,(span<pstore::sat_entry,__1L> *)&sStack_58,0);
          gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::
          span_iterator(&sStack_80,(span<pstore::sat_entry,__1L> *)&sStack_58,
                        sStack_58.super_extent_type<_1L>.size_);
          while ((sStack_70.span_ != sStack_80.span_ || (sStack_70.index_ != sStack_80.index_))) {
            ptVar9 = gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::
                     operator*(&sStack_70);
            if ((ptVar9->region).
                super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                *(element_type **)(lVar15 + -0x10)) {
              assert_failed("segment.region == region",
                            "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                            ,0x67);
            }
            p_Var4 = (ptVar9->region).
                     super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (ptVar9->region).
            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (ptVar9->region).
            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            p_Var4 = (ptVar9->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (ptVar9->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (ptVar9->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::
            operator++(&sStack_70);
          }
          lVar17 = *(long *)pcVar18 + 0x200000;
          lVar15 = *(long *)(lVar15 + -0x10);
          lVar11 = *(long *)pcVar18 + 0x40;
          uVar13 = 0x4001;
          do {
            if (*(long *)(lVar11 + -0x30) == lVar15) {
              lVar12 = lVar11 + -0x40;
              break;
            }
            if (*(long *)(lVar11 + -0x10) == lVar15) {
              lVar12 = lVar11 + -0x20;
              break;
            }
            lVar12 = lVar11;
            if (*(long *)(lVar11 + 0x10) == lVar15) break;
            if (*(long *)(lVar11 + 0x30) == lVar15) {
              lVar12 = lVar11 + 0x20;
              break;
            }
            uVar13 = uVar13 - 1;
            lVar11 = lVar11 + 0x80;
            lVar12 = lVar17;
          } while (1 < uVar13);
          if (lVar12 != lVar17) {
            assert_failed("std::all_of ( std::begin (*sat_), std::end (*sat_), [&region] (sat_entry const & segment) { return segment.region != region; })"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                          ,0x6e);
          }
          lVar15 = *(long *)((long)pcVar18 + 0x30);
          *(long *)((long)pcVar18 + 0x30) = lVar15 + -0x10;
          p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar15 + -8);
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
        }
        if (uVar5 < uVar16) {
          return;
        }
      }
      plVar10 = (long *)(*(long *)pcVar18 + 0x200000);
      plVar8 = (long *)(*(long *)pcVar18 + 0x40);
      uVar5 = 0x4001;
      do {
        if (plVar8[-6] != 0 || plVar8[-8] != 0) {
          plVar14 = plVar8 + -8;
          break;
        }
        if (plVar8[-2] != 0 || plVar8[-4] != 0) {
          plVar14 = plVar8 + -4;
          break;
        }
        plVar14 = plVar8;
        if (plVar8[2] != 0 || *plVar8 != 0) break;
        if (plVar8[6] != 0 || plVar8[4] != 0) {
          plVar14 = plVar8 + 4;
          break;
        }
        uVar5 = uVar5 - 1;
        plVar8 = plVar8 + 0x10;
        plVar14 = plVar10;
      } while (1 < uVar5);
      if (plVar14 == plVar10) {
        return;
      }
      assert_failed("std::all_of (std::begin (*sat_), std::end (*sat_), [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x77);
    }
    if (*(long *)((long)((this->sat_)._M_t.
                         super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                         .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                        _M_head_impl)->_M_elems + uVar5 * 0x20 + 0xffffffffffffffe0) == 0) {
      assert_failed("sat_->at (last_sat_entry - 1).value != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x83);
    }
  }
  if ((long)old_length < 0) {
    assert_failed("old_length <= static_cast<std::make_unsigned<region_difference_type>::type> ( std::numeric_limits<region_difference_type>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                  ,0x95);
  }
  _Var3._M_head_impl =
       (this->sat_)._M_t.
       super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  psVar1 = (this->regions_).
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  segment_end = _Var3._M_head_impl[1]._M_elems;
  pvVar6 = (sat_iterator)((long)(_Var3._M_head_impl)->_M_elems + uVar5 * 0x20);
  for (region = (this->regions_).
                super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                ._M_impl.super__Vector_impl_data._M_start + old_length; region != psVar1;
      region = region + 1) {
    pvVar6 = slice_region_into_segments(region,pvVar6,segment_end);
  }
  lVar15 = (long)segment_end - (long)pvVar6 >> 7;
  pvVar7 = pvVar6;
  if (0 < lVar15) {
    pvVar7 = (sat_iterator)
             ((long)&(pvVar6->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             ((long)segment_end - (long)pvVar6 & 0xffffffffffffff80U));
    lVar15 = lVar15 + 1;
    pvVar6 = pvVar6 + 2;
    do {
      if (pvVar6[-2].region.
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          pvVar6[-2].value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        pvVar6 = pvVar6 + -2;
        goto LAB_001310d0;
      }
      if (pvVar6[-1].region.
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          pvVar6[-1].value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        pvVar6 = pvVar6 + -1;
        goto LAB_001310d0;
      }
      if ((pvVar6->region).
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          (pvVar6->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) goto LAB_001310d0;
      if (pvVar6[1].region.
          super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 ||
          pvVar6[1].value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        pvVar6 = pvVar6 + 1;
        goto LAB_001310d0;
      }
      lVar15 = lVar15 + -1;
      pvVar6 = pvVar6 + 4;
    } while (1 < lVar15);
  }
  lVar15 = (long)segment_end - (long)pvVar7 >> 5;
  if (lVar15 != 1) {
    if (lVar15 != 2) {
      pvVar6 = segment_end;
      if ((lVar15 != 3) ||
         (pvVar6 = pvVar7,
         (pvVar7->region).super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != (element_type *)0x0 ||
         (pvVar7->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0)) goto LAB_001310d0;
      pvVar7 = pvVar7 + 1;
    }
    pvVar6 = pvVar7;
    if ((pvVar7->region).super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0 ||
        (pvVar7->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) goto LAB_001310d0;
    pvVar7 = pvVar7 + 1;
  }
  pvVar6 = pvVar7;
  if ((pvVar7->region).super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0 &&
      (pvVar7->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pvVar6 = segment_end;
  }
LAB_001310d0:
  if (pvVar6 == segment_end) {
    return;
  }
  assert_failed("std::all_of (segment_it, segment_end, [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                ,0x9f);
}

Assistant:

void storage::update_master_pointers (std::size_t const old_length) {

        std::uint64_t last_sat_entry = 0;
        if (old_length > 0) {
            PSTORE_ASSERT (old_length < regions_.size ());
            region::memory_mapper_ptr const & region = regions_[old_length - 1];
            last_sat_entry = (region->offset () + region->size ()) / address::segment_size;
            PSTORE_ASSERT (sat_->at (last_sat_entry - 1).value != nullptr);
        }

        auto segment_it = std::begin (*sat_);
        auto const segment_end = std::end (*sat_);
        using segment_difference_type =
            std::iterator_traits<decltype (segment_it)>::difference_type;

        PSTORE_ASSERT (last_sat_entry <=
                       static_cast<std::make_unsigned<segment_difference_type>::type> (
                           std::numeric_limits<segment_difference_type>::max ()));
        std::advance (segment_it, static_cast<segment_difference_type> (last_sat_entry));

        auto region_it = std::begin (regions_);
        auto const region_end = std::end (regions_);

        using region_difference_type = std::iterator_traits<decltype (region_it)>::difference_type;
        PSTORE_ASSERT (old_length <= static_cast<std::make_unsigned<region_difference_type>::type> (
                                         std::numeric_limits<region_difference_type>::max ()));
        std::advance (region_it, static_cast<region_difference_type> (old_length));

        for (; region_it != region_end; ++region_it) {
            segment_it = storage::slice_region_into_segments (*region_it, segment_it, segment_end);
        }

        // Guarantee that segments beyond the mapped memory blocks are null.
        PSTORE_ASSERT (std::all_of (segment_it, segment_end, [] (sat_entry const & s) {
            return s.value == nullptr && s.region == nullptr;
        }));
    }